

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void confinePointer(_GLFWwindow *window)

{
  zwp_confined_pointer_v1 *pzVar1;
  zwp_confined_pointer_v1_listener *in_RDI;
  uint32_t in_stack_00000034;
  wl_region *in_stack_00000038;
  wl_pointer *in_stack_00000040;
  wl_surface *in_stack_00000048;
  zwp_pointer_constraints_v1 *in_stack_00000050;
  
  pzVar1 = zwp_pointer_constraints_v1_confine_pointer
                     (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                      in_stack_00000034);
  in_RDI[0x44].unconfined = (_func_void_void_ptr_zwp_confined_pointer_v1_ptr *)pzVar1;
  zwp_confined_pointer_v1_add_listener((zwp_confined_pointer_v1 *)window,in_RDI,(void *)0x9ebef4);
  return;
}

Assistant:

static void confinePointer(_GLFWwindow* window)
{
    window->wl.confinedPointer =
        zwp_pointer_constraints_v1_confine_pointer(
            _glfw.wl.pointerConstraints,
            window->wl.surface,
            _glfw.wl.pointer,
            NULL,
            ZWP_POINTER_CONSTRAINTS_V1_LIFETIME_PERSISTENT);

    zwp_confined_pointer_v1_add_listener(window->wl.confinedPointer,
                                         &confinedPointerListener,
                                         window);
}